

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

int acmod_process_full_cep(acmod_t *acmod,mfcc_t ***inout_cep,int *inout_n_frames)

{
  int32 iVar1;
  mfcc_t ***pppmVar2;
  
  if (acmod->mfcfh != (FILE *)0x0) {
    acmod_log_mfc(acmod,*inout_cep,*inout_n_frames);
  }
  if (acmod->n_feat_alloc < *inout_n_frames) {
    feat_array_free(acmod->feat_buf);
    pppmVar2 = feat_array_alloc(acmod->fcb,*inout_n_frames);
    acmod->feat_buf = pppmVar2;
    acmod->n_feat_alloc = *inout_n_frames;
    acmod->n_feat_frame = 0;
    acmod->feat_outidx = 0;
  }
  iVar1 = feat_s2mfc2feat_live(acmod->fcb,*inout_cep,inout_n_frames,1,1,acmod->feat_buf);
  acmod->n_feat_frame = iVar1;
  if (iVar1 <= acmod->n_feat_alloc) {
    *inout_cep = *inout_cep + *inout_n_frames;
    *inout_n_frames = 0;
    return iVar1;
  }
  __assert_fail("acmod->n_feat_frame <= acmod->n_feat_alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                ,0x20c,"int acmod_process_full_cep(acmod_t *, mfcc_t ***, int *)");
}

Assistant:

static int
acmod_process_full_cep(acmod_t *acmod,
                       mfcc_t ***inout_cep,
                       int *inout_n_frames)
{
    int32 nfr;

    /* Write to log file. */
    if (acmod->mfcfh)
        acmod_log_mfc(acmod, *inout_cep, *inout_n_frames);

    /* Resize feat_buf to fit. */
    if (acmod->n_feat_alloc < *inout_n_frames) {

        if (*inout_n_frames > MAX_N_FRAMES)
            E_FATAL("Batch processing can not process more than %d frames "
                    "at once, requested %d\n", MAX_N_FRAMES, *inout_n_frames);

        feat_array_free(acmod->feat_buf);
        acmod->feat_buf = feat_array_alloc(acmod->fcb, *inout_n_frames);
        acmod->n_feat_alloc = *inout_n_frames;
        acmod->n_feat_frame = 0;
        acmod->feat_outidx = 0;
    }
    /* Make dynamic features. */
    nfr = feat_s2mfc2feat_live(acmod->fcb, *inout_cep, inout_n_frames,
                               TRUE, TRUE, acmod->feat_buf);
    acmod->n_feat_frame = nfr;
    assert(acmod->n_feat_frame <= acmod->n_feat_alloc);
    *inout_cep += *inout_n_frames;
    *inout_n_frames = 0;
    return nfr;
}